

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseIfExpr(Parser *this)

{
  long *plVar1;
  undefined8 uVar2;
  bool bVar3;
  Parser *in_RSI;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  undefined1 local_88 [16];
  undefined1 local_78 [40];
  Token keyword;
  
  Token::Token(&keyword,&in_RSI->m_previous);
  parseExpr((Parser *)(local_88 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Expected \'{\' or \'=>\' before if expression body.",
             (allocator<char> *)local_a0);
  expectBlock((Parser *)local_88,(string *)in_RSI);
  std::__cxx11::string::~string((string *)local_78);
  local_78._0_8_ = (CompileContext *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  std::make_unique<enact::UnitExpr,enact::Token&>((Token *)local_90);
  std::
  make_unique<enact::BlockExpr,std::vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>,std::unique_ptr<enact::UnitExpr,std::default_delete<enact::UnitExpr>>>
            ((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
              *)local_a0,
             (unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_78);
  if (local_90 != (undefined1  [8])0x0) {
    (*(code *)(((tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_> *)
               &(((string *)local_90)->_M_dataplus)._M_p)->
              super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>).
              super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl[1]._vptr_Stmt)();
  }
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_78);
  bVar3 = consume(in_RSI,ELSE);
  if (bVar3) {
    bVar3 = consume(in_RSI,IF);
    if (bVar3) {
      parseIfExpr((Parser *)local_78);
      plVar1 = (long *)(((Options *)(local_a0._0_8_ + 0x20))->m_filename)._M_dataplus._M_p;
      (((Options *)(local_a0._0_8_ + 0x20))->m_filename)._M_dataplus._M_p = (pointer)local_78._0_8_;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,"Expected \'{\' or \'=>\' after \'else\'.",
                 (allocator<char> *)(local_a0 + 0xf));
      expectBlock((Parser *)local_90,(string *)in_RSI);
      uVar2 = local_a0._0_8_;
      local_a0._0_8_ = local_90;
      if ((CompileContext *)uVar2 != (CompileContext *)0x0) {
        (*(code *)(((tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_> *)
                   &(((string *)uVar2)->_M_dataplus)._M_p)->
                  super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>).
                  super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl[1]._vptr_Stmt)();
      }
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  std::
  make_unique<enact::IfExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>,enact::Token>
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_78,
             (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)(local_88 + 8),
             (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)local_88,
             (Token *)local_a0);
  this->m_context = (CompileContext *)local_78._0_8_;
  if ((CompileContext *)local_a0._0_8_ != (CompileContext *)0x0) {
    (*(code *)(((tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_> *)
               &(((string *)local_a0._0_8_)->_M_dataplus)._M_p)->
              super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>).
              super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl[1]._vptr_Stmt)();
  }
  if ((CompileContext *)local_88._0_8_ != (CompileContext *)0x0) {
    (**(code **)(*(long *)local_88._0_8_ + 8))();
  }
  if ((long *)local_88._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_88._8_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&keyword.lexeme);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseIfExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> thenBlock = expectBlock("Expected '{' or '=>' before if expression body.");

        std::unique_ptr<BlockExpr> elseBlock = std::make_unique<BlockExpr>(
                std::vector<std::unique_ptr<Stmt>>{},
                std::make_unique<UnitExpr>(m_previous));

        if (consume(TokenType::ELSE)) {
            // Special case, so we can type 'else if' instead of 'else => if'
            if (consume(TokenType::IF)) {
                elseBlock->expr = parseIfExpr();
            } else {
                elseBlock = expectBlock("Expected '{' or '=>' after 'else'.");
            }
        }

        return std::make_unique<IfExpr>(
                std::move(condition),
                std::move(thenBlock),
                std::move(elseBlock),
                std::move(keyword));
    }